

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  Value VVar1;
  global_State *pgVar2;
  TValue *pTVar3;
  GCObject *pGVar4;
  long lVar5;
  StkId pTVar6;
  long lVar7;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  if (L->ci == L->base_ci) {
    pTVar3 = &L->l_gt;
  }
  else {
    pTVar3 = (TValue *)&(((L->ci->func->value).gc)->h).array;
  }
  VVar1 = pTVar3->value;
  pGVar4 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,(ulong)(n * 0x10 + 0x28));
  pgVar2 = L->l_G;
  (pGVar4->gch).next = pgVar2->rootgc;
  pgVar2->rootgc = pGVar4;
  (pGVar4->gch).marked = pgVar2->currentwhite & 3;
  (pGVar4->gch).tt = '\x06';
  (pGVar4->h).flags = '\x01';
  (pGVar4->h).array = (TValue *)VVar1;
  (pGVar4->h).lsizenode = (lu_byte)n;
  (pGVar4->h).node = (Node *)fn;
  pTVar6 = L->top + -(ulong)(uint)n;
  L->top = pTVar6;
  if (n != 0) {
    lVar5 = (long)n;
    lVar7 = lVar5 << 4;
    do {
      pTVar6 = L->top;
      *(undefined8 *)((long)pGVar4 + lVar7 + 0x18) =
           *(undefined8 *)((long)&pTVar6[-1].value + lVar7);
      *(undefined4 *)((long)pGVar4 + lVar7 + 0x20) = *(undefined4 *)((long)pTVar6 + lVar7 + -8);
      lVar7 = lVar7 + -0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    pTVar6 = L->top;
  }
  (pTVar6->value).p = pGVar4;
  pTVar6->tt = 6;
  L->top = L->top + 1;
  return;
}

Assistant:

static void lua_pushcclosure(lua_State*L,lua_CFunction fn,int n){
Closure*cl;
luaC_checkGC(L);
api_checknelems(L,n);
cl=luaF_newCclosure(L,n,getcurrenv(L));
cl->c.f=fn;
L->top-=n;
while(n--)
setobj(L,&cl->c.upvalue[n],L->top+n);
setclvalue(L,L->top,cl);
api_incr_top(L);
}